

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

reentrant_put_transaction<Func> * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
::
try_start_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,int>
          (reentrant_put_transaction<Func> *__return_storage_ptr__,
          lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
          *this,progress_guarantee i_progress_guarantee,int *i_construction_params)

{
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *pFVar1;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> FVar2;
  reentrant_put_transaction<Func> local_a8;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *local_78;
  FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *type_storage;
  runtime_type *type;
  undefined1 local_60 [7];
  bool is_noexcept;
  undefined1 local_40 [8];
  Allocation push_data;
  int *i_construction_params_local;
  progress_guarantee i_progress_guarantee_local;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *this_local;
  
  push_data.m_user_storage = i_construction_params;
  detail::
  LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)0>>
  ::try_inplace_allocate<1ul,true,4ul,4ul>((Allocation *)local_40,this,i_progress_guarantee);
  if (push_data.m_next_ptr == 0) {
    memset(local_60,0,0x20);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::reentrant_put_transaction
              ((reentrant_put_transaction<Func> *)local_60);
    reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
    ::
    reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,void>
              ((reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
                *)__return_storage_ptr__,(reentrant_put_transaction<Func> *)local_60);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction
              ((reentrant_put_transaction<Func> *)local_60);
  }
  else {
    type._7_1_ = 0;
    type_storage = (FunctionRuntimeType<(density::function_type_erasure)1,_void_()> *)0x0;
    pFVar1 = detail::
             LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
             ::type_after_control((ControlBlock *)local_40);
    local_78 = pFVar1;
    FVar2 = detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>::make<Func>();
    pFVar1->m_align_invoke_destroy = FVar2.m_align_invoke_destroy;
    type_storage = pFVar1;
    density_tests::
    LfFunctionQueueSamples<(density::function_type_erasure)1,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::func_queue_try_reentrant_put_samples::Func::Func
              ((Func *)push_data.m_next_ptr,*push_data.m_user_storage);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::reentrant_put_transaction
              (&local_a8,0,
               (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                *)this,(Allocation *)local_40);
    reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
    ::
    reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func,void>
              ((reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_try_reentrant_put_samples(std::ostream&)::Func>
                *)__return_storage_ptr__,&local_a8);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          try_start_reentrant_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)) &&
            noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>())))
        {
            auto push_data = Base::template try_inplace_allocate<
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>(i_progress_guarantee);
            if (push_data.m_user_storage == nullptr)
            {
                return reentrant_put_transaction<ELEMENT_TYPE>();
            }

            constexpr bool is_noexcept =
              std::is_nothrow_constructible<ELEMENT_TYPE, CONSTRUCTION_PARAMS...>::value &&
              noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>()));

            runtime_type * type = nullptr;

            if (is_noexcept)
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            else
            {
                try
                {
                    auto const type_storage = Base::type_after_control(push_data.m_control_block);
                    DENSITY_ASSUME(type_storage != nullptr);
                    type =
                      new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                    DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                    new (push_data.m_user_storage)
                      ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
                }
                catch (...)
                {
                    if (type != nullptr)
                        type->RUNTIME_TYPE::~RUNTIME_TYPE();

                    Base::cancel_put_nodestroy_impl(push_data);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT
                }
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }